

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O2

dict * wb_dict_new(dict_compare_func cmp_func)

{
  dict *pdVar1;
  wb_tree *pwVar2;
  
  pdVar1 = (dict *)(*dict_malloc_func)(0x10);
  if (pdVar1 != (dict *)0x0) {
    pwVar2 = wb_tree_new(cmp_func);
    pdVar1->_object = pwVar2;
    if (pwVar2 != (wb_tree *)0x0) {
      pdVar1->_vtable = &wb_tree_vtable;
      return pdVar1;
    }
    (*dict_free_func)(pdVar1);
  }
  return (dict *)0x0;
}

Assistant:

dict*
wb_dict_new(dict_compare_func cmp_func)
{
    dict* dct = MALLOC(sizeof(*dct));
    if (dct) {
	if (!(dct->_object = wb_tree_new(cmp_func))) {
	    FREE(dct);
	    return NULL;
	}
	dct->_vtable = &wb_tree_vtable;
    }
    return dct;
}